

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O2

void close_connection_with_error
               (CONNECTION_HANDLE connection,char *condition_value,char *description,AMQP_VALUE info
               )

{
  CONNECTION_STATE connection_state;
  int iVar1;
  ERROR_HANDLE error;
  LOGGER_LOG p_Var2;
  
  error = error_create(condition_value);
  if (error == (ERROR_HANDLE)0x0) {
    iVar1 = xio_close(connection->io,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
    if (iVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                  ,"close_connection_with_error",0x209,1,"xio_close failed");
      }
    }
    connection_set_state(connection,CONNECTION_STATE_END);
    return;
  }
  iVar1 = error_set_description(error,description);
  if (iVar1 == 0) {
    if (info != (AMQP_VALUE)0x0) {
      iVar1 = error_set_info(error,info);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                    ,"close_connection_with_error",0x220,1,"Cannot set error info on CLOSE frame");
        }
        iVar1 = xio_close(connection->io,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
        if (iVar1 != 0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            iVar1 = 0x225;
            goto LAB_0010f145;
          }
        }
        goto LAB_0010f14a;
      }
    }
    iVar1 = send_close_frame(connection,error);
    if (iVar1 == 0) {
      connection_state = CONNECTION_STATE_DISCARDING;
      goto LAB_0010f14c;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"close_connection_with_error",0x22c,1,"Cannot send CLOSE frame");
    }
    iVar1 = xio_close(connection->io,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
    if (iVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        iVar1 = 0x231;
        goto LAB_0010f145;
      }
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"close_connection_with_error",0x213,1,"Cannot set error description on CLOSE frame"
               );
    }
    iVar1 = xio_close(connection->io,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
    if (iVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        iVar1 = 0x218;
LAB_0010f145:
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                  ,"close_connection_with_error",iVar1,1,"xio_close failed");
      }
    }
  }
LAB_0010f14a:
  connection_state = CONNECTION_STATE_END;
LAB_0010f14c:
  connection_set_state(connection,connection_state);
  error_destroy(error);
  return;
}

Assistant:

static void close_connection_with_error(CONNECTION_HANDLE connection, const char* condition_value, const char* description, AMQP_VALUE info)
{
    ERROR_HANDLE error_handle = error_create(condition_value);

    if (error_handle == NULL)
    {
        /* Codes_S_R_S_CONNECTION_01_214: [If the close frame cannot be constructed or sent, the connection shall be closed and set to the END state.] */
        if (xio_close(connection->io, NULL, NULL) != 0)
        {
            LogError("xio_close failed");
        }

        connection_set_state(connection, CONNECTION_STATE_END);
    }
    else
    {
        /* Codes_S_R_S_CONNECTION_01_219: [The error description shall be set to an implementation defined string.] */
        if (error_set_description(error_handle, description) != 0)
        {
            LogError("Cannot set error description on CLOSE frame");

            /* Codes_S_R_S_CONNECTION_01_214: [If the close frame cannot be constructed or sent, the connection shall be closed and set to the END state.] */
            if (xio_close(connection->io, NULL, NULL) != 0)
            {
                LogError("xio_close failed");
            }

            connection_set_state(connection, CONNECTION_STATE_END);
        }
        else if ((info != NULL) &&
            (error_set_info(error_handle, info) != 0))
        {
            LogError("Cannot set error info on CLOSE frame");

            /* Codes_S_R_S_CONNECTION_01_214: [If the close frame cannot be constructed or sent, the connection shall be closed and set to the END state.] */
            if (xio_close(connection->io, NULL, NULL) != 0)
            {
                LogError("xio_close failed");
            }

            connection_set_state(connection, CONNECTION_STATE_END);
        }
        else if (send_close_frame(connection, error_handle) != 0)
        {
            LogError("Cannot send CLOSE frame");

            /* Codes_S_R_S_CONNECTION_01_214: [If the close frame cannot be constructed or sent, the connection shall be closed and set to the END state.] */
            if (xio_close(connection->io, NULL, NULL) != 0)
            {
                LogError("xio_close failed");
            }

            connection_set_state(connection, CONNECTION_STATE_END);
        }
        else
        {
            /* Codes_S_R_S_CONNECTION_01_213: [When passing the bytes to frame_codec fails, a CLOSE frame shall be sent and the state shall be set to DISCARDING.] */
            /* Codes_S_R_S_CONNECTION_01_055: [DISCARDING The DISCARDING state is a variant of the CLOSE SENT state where the close is triggered by an error.] */
            /* Codes_S_R_S_CONNECTION_01_010: [After writing this frame the peer SHOULD continue to read from the connection until it receives the partner's close frame ] */
            connection_set_state(connection, CONNECTION_STATE_DISCARDING);
        }

        error_destroy(error_handle);
    }
}